

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O0

void absl::lts_20250127::functional_internal::
     InvokeObject<absl::lts_20250127::cord_internal::CordRepBtree::PrependSlow(absl::lts_20250127::cord_internal::CordRepBtree*,absl::lts_20250127::cord_internal::CordRep*)::__0,void,absl::lts_20250127::cord_internal::CordRep*,unsigned_long,unsigned_long>
               (VoidPtr ptr,type args,type_conflict3 args_1,type_conflict3 args_2)

{
  anon_class_8_1_8992209c *o;
  type_conflict3 args_local_2;
  type_conflict3 args_local_1;
  type args_local;
  VoidPtr ptr_local;
  
  o = (anon_class_8_1_8992209c *)args_2;
  args_local_2 = args_1;
  args_local_1 = (type_conflict3)args;
  args_local = (type)ptr;
  std::
  invoke<absl::lts_20250127::cord_internal::CordRepBtree::PrependSlow(absl::lts_20250127::cord_internal::CordRepBtree*,absl::lts_20250127::cord_internal::CordRep*)::__0_const&,absl::lts_20250127::cord_internal::CordRep*,unsigned_long,unsigned_long>
            ((anon_class_8_1_8992209c *)ptr.obj,(CordRep **)&args_local_1,&args_local_2,
             (unsigned_long *)&o);
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}